

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall ON_Font::IsEngravingFont(ON_Font *this)

{
  bool bVar1;
  bool bVar2;
  Type TVar3;
  long lVar4;
  wchar_t *font_name;
  void *pvVar5;
  ON_wString *pOVar6;
  ON_wString *rhs;
  int iVar7;
  ulong uVar8;
  InternalHashToName *key_00;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  InternalHashToName key [4];
  ON_wString local_f8 [4];
  undefined1 local_d8 [24];
  undefined8 local_c0;
  InternalHashToName local_b8 [4];
  
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_family_name);
  pOVar6 = &this->m_loc_family_name;
  if (!bVar1) {
    pOVar6 = &this->m_en_family_name;
  }
  ON_wString::ON_wString(local_f8,pOVar6);
  ON_wString::ON_wString(local_f8 + 1,&this->m_en_family_name);
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_postscript_name);
  pOVar6 = &this->m_loc_postscript_name;
  if (!bVar1) {
    pOVar6 = &this->m_en_postscript_name;
  }
  ON_wString::ON_wString(local_f8 + 2,pOVar6);
  ON_wString::ON_wString(local_f8 + 3,&this->m_en_postscript_name);
  lVar4 = 0;
  do {
    *(undefined4 *)(local_b8[0].m_dirty_name_hash.m_digest + lVar4 + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    *(undefined8 *)(local_b8[0].m_dirty_name_hash.m_digest + lVar4) =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)(local_b8[0].m_dirty_name_hash.m_digest + lVar4 + 8) =
         ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)((long)(&local_b8[0].m_dirty_name_hash + 1) + lVar4 + 4) = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x80);
  uVar10 = 0;
  bVar1 = true;
  iVar9 = 0;
  do {
    pOVar6 = local_f8 + uVar10;
    bVar2 = ON_wString::IsEmpty(pOVar6);
    if (!bVar2) {
      bVar2 = ON_wString::IsEmpty(pOVar6);
      if (uVar10 != 0 && !bVar2) {
        uVar8 = 1;
        rhs = local_f8;
        do {
          bVar2 = ::operator==(pOVar6,rhs);
          bVar11 = uVar8 < uVar10;
          rhs = rhs + 1;
          uVar8 = uVar8 + 1;
        } while (bVar11 && !bVar2);
      }
      if (bVar2 == false) {
        font_name = ON_wString::operator_cast_to_wchar_t_(pOVar6);
        FontNameHash((ON_SHA1_Hash *)local_d8,font_name,true);
        local_c0 = 0;
        key_00 = local_b8 + iVar9;
        *(undefined8 *)(key_00->m_dirty_name_hash).m_digest = local_d8._0_8_;
        *(undefined8 *)(local_b8[iVar9].m_dirty_name_hash.m_digest + 8) = local_d8._8_8_;
        *(undefined8 *)(local_b8[iVar9].m_dirty_name_hash.m_digest + 0x10) = local_d8._16_8_;
        local_b8[iVar9].m_family_name = (wchar_t *)0x0;
        if (0 < iVar9) {
          iVar7 = 1;
          do {
            bVar11 = ::operator==(&key_00->m_dirty_name_hash,&local_b8[uVar10].m_dirty_name_hash);
            bVar2 = iVar7 < iVar9;
            iVar7 = iVar7 + 1;
          } while (bVar2 && !bVar11);
          if (bVar11) goto LAB_0048595b;
        }
        if ((Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map == '\0') &&
           (iVar7 = __cxa_guard_acquire(&Internal_IsEngravingFont(InternalHashToName_const*)::
                                         double_line_name_map), iVar7 != 0)) {
          FontNameHash((ON_SHA1_Hash *)
                       Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map,
                       L"OrachTech2Lotf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._24_8_ =
               anon_var_dwarf_26bc29;
          FontNameHash((ON_SHA1_Hash *)
                       (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map +
                       0x20),L"OrachTech2Lotf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._56_8_ =
               anon_var_dwarf_26bc29;
          FontNameHash((ON_SHA1_Hash *)
                       (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map +
                       0x40),L"OrachTechDemo2Lotf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._88_8_ =
               anon_var_dwarf_26bc35;
          FontNameHash((ON_SHA1_Hash *)
                       (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map +
                       0x60),L"OrachTechDemo2Lotf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._120_8_ =
               anon_var_dwarf_26bc35;
          FontNameHash((ON_SHA1_Hash *)
                       (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map +
                       0x80),L"OrachTech2Lttf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._152_8_ =
               anon_var_dwarf_26bc41;
          FontNameHash((ON_SHA1_Hash *)
                       (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map +
                       0xa0),L"OrachTech2Lttf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._184_8_ =
               anon_var_dwarf_26bc41;
          FontNameHash((ON_SHA1_Hash *)
                       (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map +
                       0xc0),L"OrachTechDemo2Lttf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._216_8_ =
               anon_var_dwarf_26bc4d;
          FontNameHash((ON_SHA1_Hash *)
                       (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map +
                       0xe0),L"OrachTechDemo2Lttf",false);
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._248_8_ =
               anon_var_dwarf_26bc4d;
          __cxa_guard_release(&Internal_IsEngravingFont(InternalHashToName_const*)::
                               double_line_name_map);
        }
        if (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map_count == 0) {
          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map_count =
               InternalHashToName::SortAndCullByHash
                         ((InternalHashToName *)
                          Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map,
                          8);
        }
        pvVar5 = bsearch(key_00,Internal_IsEngravingFont(InternalHashToName_const*)::
                                double_line_name_map,
                         Internal_IsEngravingFont(InternalHashToName_const*)::
                         double_line_name_map_count,0x20,InternalHashToName::CompareHash);
        if ((pvVar5 != (void *)0x0) ||
           (TVar3 = Internal_FigureTypeFromHashedFontName(key_00),
           (TVar3 & (Perimeter|SingleStroke)) == SingleStroke)) break;
        iVar9 = iVar9 + 1;
      }
    }
LAB_0048595b:
    bVar1 = uVar10 < 3;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  lVar4 = 0x18;
  do {
    ON_wString::~ON_wString((ON_wString *)((long)&local_f8[0].m_s + lVar4));
    lVar4 = lVar4 + -8;
  } while (lVar4 != -8);
  return bVar1;
}

Assistant:

bool ON_Font::IsEngravingFont() const
{
  const ON_wString names[] =
  {
    FamilyName(),
    FamilyName(ON_Font::NameLocale::English),
    PostScriptName(),
    PostScriptName(ON_Font::NameLocale::English)
  };
  
  InternalHashToName key[sizeof(names)/sizeof(names[0])];

  const int name_count = (int)(sizeof(names) / sizeof(names[0]));
  int key_count = 0;
  for (int i = 0; i < name_count; i++)
  {
    const ON_wString& name = names[i];
    if (name.IsEmpty())
      continue;

    // computing the hash is much more expensive than checking for duplicate names (which is common)
    bool bSkipName = name.IsEmpty();
    for (int j = 0; false == bSkipName && j < i; j++)
      bSkipName = (name == names[j]);
    if (bSkipName)
      continue;

    // compute name hash
    key[key_count] = InternalHashToName(name, nullptr);

    // searching for a duplicate hash is more expensive than checking for duplicate hash 
    // (which is common because of space and hyphen differences between family and postscript names)
    for (int j = 0; false == bSkipName && j < key_count; j++)
      bSkipName = (key[key_count].m_dirty_name_hash == key[i].m_dirty_name_hash);
    if (bSkipName)
      continue;

    // search for matching name hash is lists of known single stroke and double stroke fonts
    bool bIsEngravingFont = Internal_IsEngravingFont(&key[key_count]);
    key_count++;
    if (bIsEngravingFont)
      return true;
  }
  return false;
}